

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseDispatch<QFuture<void>>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_future::finallyRejected()::__0>
               (QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
               anon_class_8_1_6971b95b fn)

{
  RunFunctionTaskBase<void> *this;
  QFuture<void> QStack_38;
  TaskStartParameters local_28;
  
  local_28.threadPool = (QThreadPool *)QThreadPool::globalInstance();
  local_28.priority = 0;
  this = (RunFunctionTaskBase<void> *)operator_new(0x28);
  QtConcurrent::RunFunctionTaskBase<void>::RunFunctionTaskBase(this);
  *(undefined ***)this = &PTR_run_001293e0;
  QtConcurrent::RunFunctionTaskBase<void>::start(&QStack_38,this,&local_28);
  PromiseFulfill<QFuture<void>_>::call(&QStack_38,resolve,reject);
  QFutureInterfaceBase::~QFutureInterfaceBase(&QStack_38.d);
  return;
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            PromiseFulfill<Unqualified<Result>>::call(fn(std::forward<Args>(args)...),
                                                      resolve,
                                                      reject);
        } catch (...) {
            reject(std::current_exception());
        }
    }